

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O2

void __thiscall Music_Emu::emu_play(Music_Emu *this,long count,sample_t_conflict1 *out)

{
  int iVar1;
  undefined4 extraout_var;
  
  this->emu_time = this->emu_time + (int)count;
  if ((-1 < this->current_track_) && (this->emu_track_ended_ == false)) {
    iVar1 = (*(this->super_Gme_File)._vptr_Gme_File[0x10])(this,count);
    if ((char *)CONCAT44(extraout_var,iVar1) != (char *)0x0) {
      this->emu_track_ended_ = true;
      (this->super_Gme_File).warning_ = (char *)CONCAT44(extraout_var,iVar1);
    }
    return;
  }
  memset(out,0,count * 2);
  return;
}

Assistant:

void Music_Emu::emu_play( long count, sample_t* out )
{
	check( current_track_ >= 0 );
	emu_time += count;
	if ( current_track_ >= 0 && !emu_track_ended_ )
		end_track_if_error( play_( count, out ) );
	else
		memset( out, 0, count * sizeof *out );
}